

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

int open_tmp_file(char **out_path,char *ext,uint ext_len)

{
  size_t sVar1;
  int iVar2;
  str_t *psVar3;
  char *__s;
  ulong uVar4;
  char *__s_00;
  size_t __size;
  str_t tmp_dir;
  
  tmp_dir.name = (char *)0x0;
  tmp_dir.size = 0;
  uVar4 = (ulong)(ext_len + 1);
  if (ext_len == 0) {
    uVar4 = 0;
  }
  psVar3 = get_sys_temp_dir(&tmp_dir);
  sVar1 = tmp_dir.size;
  if (psVar3 == (str_t *)0x0) {
    perror("get_sys_temp_dir");
    return -1;
  }
  __size = uVar4 + tmp_dir.size + 0x14;
  __s = (char *)malloc(__size);
  if (__s == (char *)0x0) {
    perror("malloc");
    iVar2 = -1;
    goto LAB_0010225e;
  }
  memset(__s,0,__size);
  if ((int)uVar4 == 0) {
    snprintf(__s,__size,"%.*s%cchrome_bee_XXXXXXXX",sVar1 & 0xffffffff,tmp_dir.name,0x2f);
    iVar2 = mkstemp(__s);
    if (iVar2 == -1) {
      __s_00 = "mktemp";
LAB_0010233d:
      perror(__s_00);
      iVar2 = -1;
    }
  }
  else {
    snprintf(__s,__size,"%.*s%cchrome_bee_XXXXXXXX.%.*s",sVar1 & 0xffffffff,tmp_dir.name,0x2f,
             (ulong)ext_len,ext);
    fprintf(_stderr,
            "%s: tmp_file_template = \"%s\" tmp_file_template_size = %lu suffix_len = (%u) ext = (%s) ext_len = %u\n"
            ,"open_tmp_file",__s,__size,uVar4,ext,(ulong)ext_len);
    iVar2 = mkstemps(__s,(int)uVar4);
    if (iVar2 == -1) {
      __s_00 = "mktemps";
      goto LAB_0010233d;
    }
  }
  *out_path = __s;
LAB_0010225e:
  if (tmp_dir.name != (char *)0x0) {
    free(tmp_dir.name);
  }
  tmp_dir.name = (char *)0x0;
  if (__s != (char *)0x0 && iVar2 == -1) {
    free(__s);
  }
  return iVar2;
}

Assistant:

int
open_tmp_file (char **out_path, const char* ext, unsigned ext_len)
{
  int fd = -1;
  str_t tmp_dir = { 0 };
  size_t tmp_file_template_size = 0;
  char *tmp_file_template = NULL;
  const unsigned suffix_len = ext_len ? 1 + ext_len : 0;

  if (unlikely (get_sys_temp_dir (&tmp_dir) == NULL))
    {
      perror ("get_sys_temp_dir");
      return -1;
    }

  tmp_file_template_size = (tmp_dir.size - 1) +
    DIR_SEPARATOR_LEN + sizeof (TMP_FILENAME_TEMPLATE) + suffix_len;

  tmp_file_template = malloc (tmp_file_template_size);
  if (unlikely (tmp_file_template == NULL))
    {
      perror ("malloc");
      goto _ret;
    }
  memset (tmp_file_template, 0, tmp_file_template_size);

  if (suffix_len)
    {
      snprintf (tmp_file_template, tmp_file_template_size,
                "%.*s%c" TMP_FILENAME_TEMPLATE ".%.*s",
                (int)tmp_dir.size, tmp_dir.name, DIR_SEPARATOR, ext_len, ext);
      elog_debug ("%s: tmp_file_template = \"%s\" "
                  "tmp_file_template_size = %lu "
                  "suffix_len = (%u) "
                  "ext = (%s) "
                  "ext_len = %u\n",
                 __func__,
                 tmp_file_template,
                 tmp_file_template_size,
                 suffix_len,
                 ext,
                 ext_len);

      fd = mkstemps (tmp_file_template, suffix_len);
      if (fd == -1)
        perror("mktemps");
    }
  else
    {
      snprintf (tmp_file_template, tmp_file_template_size,
                "%.*s%c" TMP_FILENAME_TEMPLATE,
                (int)tmp_dir.size, tmp_dir.name, DIR_SEPARATOR);

      fd = mkstemp (tmp_file_template);
      if (fd == -1)
        perror("mktemp");
    }

  *out_path = tmp_file_template;

_ret:
  str_destroy (&tmp_dir);

  if (fd == -1)
    {
      if (tmp_file_template != NULL)
        free (tmp_file_template);
    }

  return fd;
}